

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int xmlParseAttributeType(xmlParserCtxtPtr ctxt,xmlEnumerationPtr *tree)

{
  byte bVar1;
  xmlParserInputPtr pxVar2;
  byte *pbVar3;
  int iVar4;
  
  pxVar2 = ctxt->input;
  pbVar3 = pxVar2->cur;
  bVar1 = *pbVar3;
  if (bVar1 < 0x49) {
    if (bVar1 == 0x43) {
      if ((((pbVar3[1] != 0x44) || (pbVar3[2] != 0x41)) || (pbVar3[3] != 0x54)) ||
         (pbVar3[4] != 0x41)) goto LAB_00138dd4;
      pxVar2->cur = pbVar3 + 5;
      pxVar2->col = pxVar2->col + 5;
      iVar4 = 1;
LAB_00138dfd:
      bVar1 = pbVar3[5];
      goto joined_r0x00138d4e;
    }
    if ((bVar1 != 0x45) || (pbVar3[1] != 0x4e)) {
LAB_00138dd4:
      iVar4 = xmlParseEnumeratedType(ctxt,tree);
      return iVar4;
    }
    if (((pbVar3[2] == 0x54) && ((pbVar3[3] == 0x49 && (pbVar3[4] == 0x54)))) && (pbVar3[5] == 0x59)
       ) {
      pxVar2->cur = pbVar3 + 6;
      pxVar2->col = pxVar2->col + 6;
      iVar4 = 5;
LAB_00138d4a:
      bVar1 = pbVar3[6];
      goto joined_r0x00138d4e;
    }
    if ((((pbVar3[2] != 0x54) || (pbVar3[3] != 0x49)) || (pbVar3[4] != 0x54)) ||
       (((pbVar3[5] != 0x49 || (pbVar3[6] != 0x45)) || (pbVar3[7] != 0x53)))) goto LAB_00138dd4;
    pxVar2->cur = pbVar3 + 8;
    pxVar2->col = pxVar2->col + 8;
    iVar4 = 6;
  }
  else {
    if (bVar1 == 0x49) {
      if (pbVar3[1] != 0x44) goto LAB_00138dd4;
      if ((((pbVar3[2] == 0x52) && (pbVar3[3] == 0x45)) && (pbVar3[4] == 0x46)) &&
         (pbVar3[5] == 0x53)) {
        pxVar2->cur = pbVar3 + 6;
        pxVar2->col = pxVar2->col + 6;
        iVar4 = 4;
        goto LAB_00138d4a;
      }
      if (((pbVar3[2] != 0x52) || (pbVar3[3] != 0x45)) || (pbVar3[4] != 0x46)) {
        pxVar2->cur = pbVar3 + 2;
        pxVar2->col = pxVar2->col + 2;
        iVar4 = 2;
        bVar1 = pbVar3[2];
        goto joined_r0x00138d4e;
      }
      pxVar2->cur = pbVar3 + 5;
      pxVar2->col = pxVar2->col + 5;
      iVar4 = 3;
      goto LAB_00138dfd;
    }
    if ((bVar1 != 0x4e) || (pbVar3[1] != 0x4d)) goto LAB_00138dd4;
    if ((pbVar3[2] != 0x54) ||
       ((((pbVar3[3] != 0x4f || (pbVar3[4] != 0x4b)) || (pbVar3[5] != 0x45)) ||
        ((pbVar3[6] != 0x4e || (pbVar3[7] != 0x53)))))) {
      if (((pbVar3[2] != 0x54) || (pbVar3[3] != 0x4f)) ||
         ((pbVar3[4] != 0x4b || ((pbVar3[5] != 0x45 || (pbVar3[6] != 0x4e)))))) goto LAB_00138dd4;
      pxVar2->cur = pbVar3 + 7;
      pxVar2->col = pxVar2->col + 7;
      iVar4 = 7;
      bVar1 = pbVar3[7];
      goto joined_r0x00138d4e;
    }
    pxVar2->cur = pbVar3 + 8;
    pxVar2->col = pxVar2->col + 8;
    iVar4 = 8;
  }
  bVar1 = pbVar3[8];
joined_r0x00138d4e:
  if (bVar1 == 0) {
    xmlParserGrow(ctxt);
  }
  return iVar4;
}

Assistant:

int
xmlParseAttributeType(xmlParserCtxtPtr ctxt, xmlEnumerationPtr *tree) {
    if (CMP5(CUR_PTR, 'C', 'D', 'A', 'T', 'A')) {
	SKIP(5);
	return(XML_ATTRIBUTE_CDATA);
     } else if (CMP6(CUR_PTR, 'I', 'D', 'R', 'E', 'F', 'S')) {
	SKIP(6);
	return(XML_ATTRIBUTE_IDREFS);
     } else if (CMP5(CUR_PTR, 'I', 'D', 'R', 'E', 'F')) {
	SKIP(5);
	return(XML_ATTRIBUTE_IDREF);
     } else if ((RAW == 'I') && (NXT(1) == 'D')) {
        SKIP(2);
	return(XML_ATTRIBUTE_ID);
     } else if (CMP6(CUR_PTR, 'E', 'N', 'T', 'I', 'T', 'Y')) {
	SKIP(6);
	return(XML_ATTRIBUTE_ENTITY);
     } else if (CMP8(CUR_PTR, 'E', 'N', 'T', 'I', 'T', 'I', 'E', 'S')) {
	SKIP(8);
	return(XML_ATTRIBUTE_ENTITIES);
     } else if (CMP8(CUR_PTR, 'N', 'M', 'T', 'O', 'K', 'E', 'N', 'S')) {
	SKIP(8);
	return(XML_ATTRIBUTE_NMTOKENS);
     } else if (CMP7(CUR_PTR, 'N', 'M', 'T', 'O', 'K', 'E', 'N')) {
	SKIP(7);
	return(XML_ATTRIBUTE_NMTOKEN);
     }
     return(xmlParseEnumeratedType(ctxt, tree));
}